

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AggregateOptionFinder::FindExtension
          (AggregateOptionFinder *this,Message *message,string *name)

{
  anon_union_8_8_13f84498_for_Symbol_2 aVar1;
  long lVar2;
  once_flag *poVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  anon_union_8_8_13f84498_for_Symbol_2 aVar8;
  long lVar9;
  long lVar10;
  Symbol SVar11;
  anon_union_8_8_13f84498_for_Symbol_2 local_50;
  long local_48;
  anon_union_8_8_13f84498_for_Symbol_2 local_40;
  anon_union_8_8_13f84498_for_Symbol_2 local_38;
  long lVar7;
  
  iVar6 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  lVar7 = CONCAT44(extraout_var,iVar6);
  SVar11 = LookupSymbolNoPlaceholder(this->builder_,name,*(string **)(lVar7 + 8),LOOKUP_ALL,true);
  aVar8 = SVar11.field_1;
  if (SVar11.type == MESSAGE) {
    if (*(char *)(*(long *)(lVar7 + 0x20) + 0x48) == '\x01') {
      bVar4 = 0 < *(int *)(aVar8.descriptor + 0x7c);
      if (0 < *(int *)(aVar8.descriptor + 0x7c)) {
        lVar9 = 0;
        lVar10 = 0;
        local_48 = lVar7;
        do {
          lVar2 = *(long *)(aVar8.descriptor + 0x50);
          if (*(long *)(lVar2 + 0x50 + lVar9) == lVar7) {
            aVar1.descriptor = (Descriptor *)(lVar2 + lVar9);
            poVar3 = *(once_flag **)(lVar2 + 0x30 + lVar9);
            if (poVar3 != (once_flag *)0x0) {
              local_50.descriptor = (Descriptor *)FieldDescriptor::TypeOnceInit;
              local_38.descriptor = aVar1.descriptor;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (poVar3,(_func_void_FieldDescriptor_ptr **)&local_50.descriptor,
                         &local_38.field_descriptor);
              lVar7 = local_48;
            }
            if ((*(int *)(lVar2 + 0x38 + lVar9) != 0xb) || (*(int *)(lVar2 + 0x3c + lVar9) != 1))
            goto LAB_00334056;
            poVar3 = *(once_flag **)(lVar2 + 0x30 + lVar9);
            if (poVar3 != (once_flag *)0x0) {
              local_50.descriptor = aVar1.descriptor;
              std::
              call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (poVar3,FieldDescriptor::TypeOnceInit,&local_50.field_descriptor);
              lVar7 = local_48;
            }
            if (*(FieldDescriptor **)(lVar2 + 0x68 + lVar9) != (FieldDescriptor *)aVar8.descriptor)
            goto LAB_00334056;
            bVar5 = false;
            local_40.descriptor = aVar1.descriptor;
          }
          else {
LAB_00334056:
            bVar5 = true;
          }
          if (!bVar5) break;
          lVar10 = lVar10 + 1;
          lVar9 = lVar9 + 0x98;
          bVar4 = lVar10 < *(int *)(aVar8.descriptor + 0x7c);
        } while (lVar10 < *(int *)(aVar8.descriptor + 0x7c));
      }
      if (bVar4) {
        return (FieldDescriptor *)local_40.descriptor;
      }
    }
  }
  else if ((SVar11.type == FIELD) &&
          (*(FieldDescriptor *)(aVar8.descriptor + 0x42) != (FieldDescriptor)0x0)) {
    return (FieldDescriptor *)aVar8.descriptor;
  }
  return (FieldDescriptor *)0x0;
}

Assistant:

const FieldDescriptor* FindExtension(Message* message,
                                       const std::string& name) const override {
    assert_mutex_held(builder_->pool_);
    const Descriptor* descriptor = message->GetDescriptor();
    Symbol result =
        builder_->LookupSymbolNoPlaceholder(name, descriptor->full_name());
    if (result.type == Symbol::FIELD &&
        result.field_descriptor->is_extension()) {
      return result.field_descriptor;
    } else if (result.type == Symbol::MESSAGE &&
               descriptor->options().message_set_wire_format()) {
      const Descriptor* foreign_type = result.descriptor;
      // The text format allows MessageSet items to be specified using
      // the type name, rather than the extension identifier. If the symbol
      // lookup returned a Message, and the enclosing Message has
      // message_set_wire_format = true, then return the message set
      // extension, if one exists.
      for (int i = 0; i < foreign_type->extension_count(); i++) {
        const FieldDescriptor* extension = foreign_type->extension(i);
        if (extension->containing_type() == descriptor &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() &&
            extension->message_type() == foreign_type) {
          // Found it.
          return extension;
        }
      }
    }
    return nullptr;
  }